

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_access_col_block(Integer s_a,Integer icol,void *idx,void *jdx,void *val)

{
  Integer proc;
  long *ptr;
  long *ptr_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Integer hi;
  Integer lo;
  Integer ld;
  int64_t *tljdx;
  int64_t *tlidx;
  int *tjdx;
  int *tidx;
  char *lptr;
  Integer local_90;
  Integer local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  Integer local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar2 = s_a + 1000;
  if (0 < SPA[lVar2].nblocks) {
    local_68 = SPA[lVar2].idx_size;
    lVar4 = 0;
    lVar1 = 0;
    do {
      if (SPA[lVar2].blkidx[lVar1] == icol) {
        local_80 = (long *)idx;
        local_78 = (long *)jdx;
        local_70 = (long *)val;
        proc = pnga_pgroup_nodeid(SPA[lVar2].grp);
        lVar3 = SPA[lVar2].offset[lVar1];
        pnga_distribution(SPA[lVar2].g_data,proc,&local_88,&local_90);
        pnga_access_ptr(SPA[lVar2].g_data,&local_88,&local_90,&local_38,&local_60);
        pnga_distribution(SPA[lVar2].g_i,proc,&local_88,&local_90);
        ptr = &local_40;
        if (local_68 == 8) {
          ptr = &local_50;
        }
        ptr_00 = &local_48;
        if (local_68 == 8) {
          ptr_00 = &local_58;
        }
        pnga_access_ptr(SPA[lVar2].g_i,&local_88,&local_90,ptr,&local_60);
        pnga_distribution(SPA[lVar2].g_j,proc,&local_88,&local_90);
        pnga_access_ptr(SPA[lVar2].g_j,&local_88,&local_90,ptr_00,&local_60);
        local_60 = (SPA[lVar2].ihi - SPA[lVar2].ilo) + 2;
        local_38 = SPA[lVar2].size * lVar3 + local_38;
        if (local_68 == 8) {
          lVar3 = lVar3 * 8 + local_58;
          lVar1 = local_60 * lVar1 * 8 + local_50;
          local_58 = lVar3;
          local_50 = lVar1;
        }
        else {
          lVar3 = (long)(int)lVar3 * 4 + local_48;
          lVar1 = (lVar4 * local_60 >> 0x1e) + local_40;
          local_48 = lVar3;
          local_40 = lVar1;
        }
        *local_80 = lVar1;
        *local_78 = lVar3;
        *local_70 = local_38;
        pnga_release(SPA[lVar2].g_data,&local_88,&local_90);
        pnga_release(SPA[lVar2].g_i,&local_88,&local_90);
        pnga_release(SPA[lVar2].g_j,&local_88,&local_90);
        return;
      }
      lVar1 = lVar1 + 1;
      lVar4 = lVar4 + 0x100000000;
    } while (SPA[lVar2].nblocks != lVar1);
  }
  *(undefined8 *)idx = 0;
  *(undefined8 *)jdx = 0;
  *(undefined8 *)val = 0;
  return;
}

Assistant:

void pnga_sprs_array_access_col_block(Integer s_a, Integer icol,
    void *idx, void *jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  char *lptr;
  Integer i,index;
  Integer longidx;
  if (SPA[hdl].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  index = -1;
  for (i=0; i<SPA[hdl].nblocks; i++) {
    if (SPA[hdl].blkidx[i] == icol) {
      index = i;
      break;
    }
  }
  if (index == -1) {
    if (longidx) {
      *(int**)idx = NULL;
      *(int**)jdx = NULL;
    } else {
      *(int64_t**)idx = NULL;
      *(int64_t**)jdx = NULL;
    }
    *(char**)val = NULL;
  }  else {
    int *tidx;
    int *tjdx;
    int64_t *tlidx;
    int64_t *tljdx;
    char *lptr;
    Integer lo, hi, ld;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
    Integer offset = SPA[hdl].offset[index];

    /* access local portions of GAs containing data */
    pnga_distribution(SPA[hdl].g_data,me,&lo,&hi);
    pnga_access_ptr(SPA[hdl].g_data,&lo,&hi,&lptr,&ld);
    pnga_distribution(SPA[hdl].g_i,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tlidx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tidx,&ld);
    }
    pnga_distribution(SPA[hdl].g_j,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tljdx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tjdx,&ld);
    }
    /* shift pointers to correct location */
    ld = SPA[hdl].ihi - SPA[hdl].ilo + 2;
    lptr = lptr + offset*SPA[hdl].size;
    if (longidx) {
      tljdx = tljdx + (int64_t)offset;
      tlidx = tlidx + (int64_t)(ld*index);
      *(int64_t**)idx = tlidx;
      *(int64_t**)jdx = tljdx;
    } else {
      tjdx = tjdx + (int)offset;
      tidx = tidx + (int)(ld*index);
      *(int**)idx = tidx;
      *(int**)jdx = tjdx;
    }
    *(char**)val = lptr;
    pnga_release(SPA[hdl].g_data,&lo,&hi);
    pnga_release(SPA[hdl].g_i,&lo,&hi);
    pnga_release(SPA[hdl].g_j,&lo,&hi);
  }
}